

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O0

unique_ptr<wabt::BrTableExpr,_std::default_delete<wabt::BrTableExpr>_> __thiscall
wabt::MakeUnique<wabt::BrTableExpr,wabt::Location&>(wabt *this,Location *args)

{
  BrTableExpr *this_00;
  Location *args_local;
  
  this_00 = (BrTableExpr *)operator_new(0xa0);
  BrTableExpr::BrTableExpr(this_00,args);
  std::unique_ptr<wabt::BrTableExpr,std::default_delete<wabt::BrTableExpr>>::
  unique_ptr<std::default_delete<wabt::BrTableExpr>,void>
            ((unique_ptr<wabt::BrTableExpr,std::default_delete<wabt::BrTableExpr>> *)this,this_00);
  return (__uniq_ptr_data<wabt::BrTableExpr,_std::default_delete<wabt::BrTableExpr>,_true,_true>)
         (__uniq_ptr_data<wabt::BrTableExpr,_std::default_delete<wabt::BrTableExpr>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}